

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O0

acmod_t * acmod_init(ps_config_t *config,logmath_t *lmath,fe_t *fe,feat_t *fcb)

{
  int iVar1;
  ps_config_t *ppVar2;
  logmath_t *plVar3;
  int16 *piVar4;
  bitvec_t *pbVar5;
  uint8 *puVar6;
  acmod_t *acmod;
  feat_t *fcb_local;
  fe_t *fe_local;
  logmath_t *lmath_local;
  ps_config_t *config_local;
  
  config_local = (ps_config_t *)
                 __ckd_calloc__(1,200,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                ,0xff);
  ppVar2 = ps_config_retain(config);
  ((acmod_t *)config_local)->config = ppVar2;
  plVar3 = logmath_retain(lmath);
  ((acmod_t *)config_local)->lmath = plVar3;
  ((acmod_t *)config_local)->state = '\0';
  iVar1 = acmod_reinit_feat((acmod_t *)config_local,fe,fcb);
  if ((iVar1 < 0) || (iVar1 = acmod_init_am((acmod_t *)config_local), iVar1 < 0)) {
    acmod_free((acmod_t *)config_local);
    config_local = (ps_config_t *)0x0;
  }
  else {
    piVar4 = (int16 *)__ckd_calloc__((long)((acmod_t *)config_local)->mdef->n_sen,2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                     ,0x10e);
    ((acmod_t *)config_local)->senone_scores = piVar4;
    pbVar5 = (bitvec_t *)
             __ckd_calloc__((long)((((acmod_t *)config_local)->mdef->n_sen + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                            ,0x10f);
    ((acmod_t *)config_local)->senone_active_vec = pbVar5;
    puVar6 = (uint8 *)__ckd_calloc__((long)((acmod_t *)config_local)->mdef->n_sen,1,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                     ,0x111);
    ((acmod_t *)config_local)->senone_active = puVar6;
    iVar1 = logmath_get_zero(((acmod_t *)config_local)->lmath);
    ((acmod_t *)config_local)->log_zero = iVar1;
    iVar1 = ps_config_bool(config,"compallsen");
    ((acmod_t *)config_local)->compallsen = (uint8)iVar1;
  }
  return (acmod_t *)config_local;
}

Assistant:

acmod_t *
acmod_init(ps_config_t *config, logmath_t *lmath, fe_t *fe, feat_t *fcb)
{
    acmod_t *acmod;

    acmod = ckd_calloc(1, sizeof(*acmod));
    acmod->config = ps_config_retain(config);
    acmod->lmath = logmath_retain(lmath);
    acmod->state = ACMOD_IDLE;

    /* Initialize or retain fe and fcb. */
    if (acmod_reinit_feat(acmod, fe, fcb) < 0)
        goto error_out;

    /* Load acoustic model parameters. */
    if (acmod_init_am(acmod) < 0)
        goto error_out;

    /* Senone computation stuff. */
    acmod->senone_scores = ckd_calloc(bin_mdef_n_sen(acmod->mdef),
                                                     sizeof(*acmod->senone_scores));
    acmod->senone_active_vec = bitvec_alloc(bin_mdef_n_sen(acmod->mdef));
    acmod->senone_active = ckd_calloc(bin_mdef_n_sen(acmod->mdef),
                                                     sizeof(*acmod->senone_active));
    acmod->log_zero = logmath_get_zero(acmod->lmath);
    acmod->compallsen = ps_config_bool(config, "compallsen");
    return acmod;

error_out:
    acmod_free(acmod);
    return NULL;
}